

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

TestCase *
Catch::makeTestCase(TestCase *__return_storage_ptr__,ITestCase *_testCase,string *_className,
                   string *_name,string *_descOrTags,SourceLineInfo *_lineInfo)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  _func_int **pp_Var3;
  pointer pcVar4;
  int iVar5;
  iterator iVar6;
  bool bVar7;
  bool bVar8;
  string desc;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  TestCaseInfo info;
  string local_198;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  ITestCase *local_148;
  string *local_140;
  SourceLineInfo *local_138;
  key_type local_130;
  undefined1 local_110 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  undefined1 local_e0 [16];
  _Alloc_hider local_d0;
  char local_c0 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  _Alloc_hider local_80;
  char local_70 [16];
  _Alloc_hider local_60;
  char local_50 [32];
  
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  pcVar4 = (_descOrTags->_M_dataplus)._M_p;
  local_138 = _lineInfo;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar4,pcVar4 + _descOrTags->_M_string_length);
  pp_Var1 = &local_178._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_178._M_impl._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"./","");
  local_148 = _testCase;
  local_140 = _className;
  if (_name->_M_string_length <
      CONCAT44(local_178._M_impl.super__Rb_tree_header._M_header._4_4_,
               local_178._M_impl.super__Rb_tree_header._M_header._M_color)) {
    bVar7 = false;
  }
  else {
    std::__cxx11::string::substr((ulong)local_110,(ulong)_name);
    if ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_110._8_8_ ==
        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)CONCAT44(local_178._M_impl.super__Rb_tree_header._M_header._4_4_,
                    local_178._M_impl.super__Rb_tree_header._M_header._M_color)) {
      if ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_110._8_8_ ==
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x0) {
        bVar7 = true;
      }
      else {
        iVar5 = bcmp((void *)local_110._0_8_,(void *)local_178._M_impl._0_8_,local_110._8_8_);
        bVar7 = iVar5 == 0;
      }
    }
    else {
      bVar7 = false;
    }
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
      operator_delete((void *)local_110._0_8_);
    }
  }
  if ((_Base_ptr *)local_178._M_impl._0_8_ != pp_Var1) {
    operator_delete((void *)local_178._M_impl._0_8_);
  }
  p_Var2 = &local_178._M_impl.super__Rb_tree_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_178._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_178._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_100._M_allocated_capacity = (size_type)(local_110 + 0x20);
  local_110._0_8_ = &PTR__TagExtracter_00161658;
  local_100._8_8_ = 0;
  local_f0._M_local_buf[0] = '\0';
  local_178._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_178._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  local_110._8_8_ = (string *)&local_178;
  TagParser::parse((TagParser *)local_110,&local_198);
  pp_Var3 = (_func_int **)(local_110 + 0x10);
  std::__cxx11::string::_M_assign((string *)&local_198);
  TagExtracter::~TagExtracter((TagExtracter *)local_110);
  local_110._0_8_ = pp_Var3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"hide","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&local_178,(key_type *)local_110);
  bVar8 = true;
  if ((_Rb_tree_header *)iVar6._M_node == p_Var2) {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,".","");
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&local_178,&local_130);
    bVar8 = (_Rb_tree_header *)iVar6._M_node != p_Var2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  if ((_func_int **)local_110._0_8_ != pp_Var3) {
    operator_delete((void *)local_110._0_8_);
  }
  TestCaseInfo::TestCaseInfo
            ((TestCaseInfo *)local_110,_name,local_140,&local_198,
             (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_178,(bool)(bVar8 | bVar7),local_138);
  TestCase::TestCase(__return_storage_ptr__,local_148,(TestCaseInfo *)local_110);
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  if (local_80._M_p != local_70) {
    operator_delete(local_80._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_b0);
  if (local_d0._M_p != local_c0) {
    operator_delete(local_d0._M_p);
  }
  if ((undefined1 *)CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) !=
      local_e0) {
    operator_delete((undefined1 *)
                    CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]));
  }
  if ((_func_int **)local_110._0_8_ != pp_Var3) {
    operator_delete((void *)local_110._0_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

TestCase makeTestCase(  ITestCase* _testCase,
                            std::string const& _className,
                            std::string const& _name,
                            std::string const& _descOrTags,
                            SourceLineInfo const& _lineInfo )
    {
        std::string desc = _descOrTags;
        bool isHidden( startsWith( _name, "./" ) );
        std::set<std::string> tags;
        TagExtracter( tags ).parse( desc );
        if( tags.find( "hide" ) != tags.end() || tags.find( "." ) != tags.end() )
            isHidden = true;

        TestCaseInfo info( _name, _className, desc, tags, isHidden, _lineInfo );
        return TestCase( _testCase, info );
    }